

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O1

size_t RVO::linearProgram3(vector<RVO::Plane,_std::allocator<RVO::Plane>_> *planes,float radius,
                          Vector3 *optVelocity,bool directionOpt,Vector3 *result)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  pointer pPVar4;
  undefined7 in_register_00000011;
  size_t planeNo;
  long lVar5;
  bool bVar6;
  float fVar7;
  size_t local_38;
  
  fVar7 = optVelocity->val_[0];
  fVar1 = optVelocity->val_[2];
  if ((int)CONCAT71(in_register_00000011,directionOpt) == 0) {
    fVar7 = fVar1 * fVar1 + fVar7 * fVar7 + optVelocity->val_[1] * optVelocity->val_[1];
    if (fVar7 <= radius * radius) {
      result->val_[2] = optVelocity->val_[2];
      *(undefined8 *)result->val_ = *(undefined8 *)optVelocity->val_;
    }
    else {
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      fVar7 = 1.0 / fVar7;
      fVar1 = optVelocity->val_[1];
      fVar2 = optVelocity->val_[2];
      result->val_[0] = optVelocity->val_[0] * fVar7 * radius;
      result->val_[1] = fVar1 * fVar7 * radius;
      result->val_[2] = fVar7 * fVar2 * radius;
    }
  }
  else {
    fVar2 = optVelocity->val_[1];
    result->val_[0] = fVar7 * radius;
    result->val_[1] = fVar2 * radius;
    result->val_[2] = fVar1 * radius;
  }
  pPVar4 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar6 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
          super__Vector_impl_data._M_finish != pPVar4;
  if (bVar6) {
    lVar5 = 0x14;
    planeNo = 0;
    do {
      fVar7 = result->val_[0];
      fVar1 = result->val_[1];
      fVar2 = result->val_[2];
      if ((0.0 < (*(float *)((long)(&pPVar4->point + -1) + lVar5) - fVar2) *
                 *(float *)((long)(pPVar4->point).val_ + lVar5) +
                 (*(float *)((long)(pPVar4->point).val_ + lVar5 + -0x14) - fVar7) *
                 *(float *)((long)(pPVar4->point).val_ + lVar5 + -8) +
                 (*(float *)((long)(pPVar4->point).val_ + lVar5 + -0x10) - fVar1) *
                 *(float *)((long)(pPVar4->point).val_ + lVar5 + -4)) &&
         (bVar3 = linearProgram2(planes,planeNo,radius,optVelocity,directionOpt,result), !bVar3)) {
        result->val_[0] = fVar7;
        result->val_[1] = fVar1;
        result->val_[2] = fVar2;
        local_38 = planeNo;
        break;
      }
      planeNo = planeNo + 1;
      pPVar4 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x18;
      bVar6 = planeNo < (ulong)(((long)(planes->
                                       super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3
                                ) * -0x5555555555555555);
    } while (bVar6);
  }
  if (!bVar6) {
    local_38 = ((long)(planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  }
  return local_38;
}

Assistant:

size_t linearProgram3(const std::vector<Plane> &planes, float radius, const Vector3 &optVelocity, bool directionOpt, Vector3 &result)
	{
		if (directionOpt) {
			/* Optimize direction. Note that the optimization velocity is of unit length in this case. */
			result = optVelocity * radius;
		}
		else if (absSq(optVelocity) > sqr(radius)) {
			/* Optimize closest point and outside circle. */
			result = normalize(optVelocity) * radius;
		}
		else {
			/* Optimize closest point and inside circle. */
			result = optVelocity;
		}

		for (size_t i = 0; i < planes.size(); ++i) {
			if (planes[i].normal * (planes[i].point - result) > 0.0f) {
				/* Result does not satisfy constraint i. Compute new optimal result. */
				const Vector3 tempResult = result;

				if (!linearProgram2(planes, i, radius, optVelocity, directionOpt, result)) {
					result = tempResult;
					return i;
				}
			}
		}

		return planes.size();
	}